

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qppmhandler.cpp
# Opt level: O0

ssize_t __thiscall QPpmHandler::read(QPpmHandler *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  QImage *in_stack_000000b8;
  int in_stack_000000c0;
  int in_stack_000000c4;
  int in_stack_000000c8;
  char in_stack_000000cf;
  QIODevice *in_stack_000000d0;
  QPpmHandler *in_stack_ffffffffffffffd8;
  undefined1 local_1;
  
  if (this->state == Error) {
    local_1 = 0;
  }
  else {
    if (this->state == Ready) {
      bVar1 = readHeader(in_stack_ffffffffffffffd8);
      if (!bVar1) {
        this->state = Error;
        local_1 = 0;
        goto LAB_0033119c;
      }
    }
    QImageIOHandler::device(&this->super_QImageIOHandler);
    bVar1 = read_pbm_body(in_stack_000000d0,in_stack_000000cf,in_stack_000000c8,in_stack_000000c4,
                          in_stack_000000c0,in_stack_000000b8);
    if (bVar1) {
      this->state = Ready;
      local_1 = 1;
    }
    else {
      this->state = Error;
      local_1 = 0;
    }
  }
LAB_0033119c:
  return CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool QPpmHandler::read(QImage *image)
{
    if (state == Error)
        return false;

    if (state == Ready && !readHeader()) {
        state = Error;
        return false;
    }

    if (!read_pbm_body(device(), type, width, height, mcc, image)) {
        state = Error;
        return false;
    }

    state = Ready;
    return true;
}